

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileStream.cpp
# Opt level: O0

RefCntAutoPtr<Diligent::BasicFileStream> __thiscall
Diligent::BasicFileStream::Create(BasicFileStream *this,Char *Path,EFileAccessMode Access)

{
  Char *Message;
  BasicFileStream *pObj;
  MakeNewRCObj<Diligent::BasicFileStream,_Diligent::IMemoryAllocator> local_78;
  undefined1 local_40 [8];
  string msg;
  Char *pCStack_18;
  EFileAccessMode Access_local;
  Char *Path_local;
  
  msg.field_2._12_4_ = Access;
  pCStack_18 = Path;
  Path_local = (Char *)this;
  if ((Path == (Char *)0x0) || (*Path == '\0')) {
    FormatString<char[31]>((string *)local_40,(char (*) [31])"Path must not be null or empty");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/BasicFileStream.cpp"
               ,0x26);
    std::__cxx11::string::~string((string *)local_40);
    RefCntAutoPtr<Diligent::BasicFileStream>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)this);
  }
  else {
    MakeNewRCObj<Diligent::BasicFileStream,_Diligent::IMemoryAllocator>::MakeNewRCObj
              (&local_78,(IObject *)0x0);
    pObj = MakeNewRCObj<Diligent::BasicFileStream,Diligent::IMemoryAllocator>::operator()
                     (&local_78,&stack0xffffffffffffffe8,
                      (EFileAccessMode *)(msg.field_2._M_local_buf + 0xc));
    RefCntAutoPtr<Diligent::BasicFileStream>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BasicFileStream> *)this,pObj);
  }
  return (RefCntAutoPtr<Diligent::BasicFileStream>)this;
}

Assistant:

RefCntAutoPtr<BasicFileStream> BasicFileStream::Create(const Char* Path, EFileAccessMode Access)
{
    if (Path == nullptr || Path[0] == '\0')
    {
        DEV_ERROR("Path must not be null or empty");
        return {};
    }

    return RefCntAutoPtr<BasicFileStream>{MakeNewRCObj<BasicFileStream>()(Path, Access)};
}